

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  opj_tcp_t *local_58;
  uint local_50;
  OPJ_UINT32 local_4c;
  OPJ_UINT32 l_comp_no;
  OPJ_UINT32 l_comp_room;
  opj_image_t *l_image;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_j2k_t *p_j2k_local;
  
  l_tcp = (opj_tcp_t *)0x0;
  l_image = (opj_image_t *)0x0;
  _l_comp_no = (opj_image_t *)0x0;
  l_cp = (opj_cp_t *)p_manager;
  p_manager_local._4_4_ = p_header_size;
  pOStack_20 = p_header_data;
  p_header_data_local = (OPJ_BYTE *)p_j2k;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xb67,
                  "OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      l_tcp = (opj_tcp_t *)&p_j2k->m_cp;
      if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
        local_58 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
      }
      else {
        local_58 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
      }
      l_image = (opj_image_t *)local_58;
      _l_comp_no = p_j2k->m_private_image;
      local_4c = 2;
      if (_l_comp_no->numcomps < 0x101) {
        local_4c = 1;
      }
      if (p_header_size < local_4c + 1) {
        opj_event_msg(p_manager,1,"Error reading COC marker\n");
        p_j2k_local._4_4_ = 0;
      }
      else {
        p_manager_local._4_4_ = p_header_size - (local_4c + 1);
        opj_read_bytes_LE(p_header_data,&local_50,local_4c);
        pOStack_20 = pOStack_20 + local_4c;
        if (local_50 < _l_comp_no->numcomps) {
          opj_read_bytes_LE(pOStack_20,
                            (OPJ_UINT32 *)(l_image[0x74].icc_profile_buf + (ulong)local_50 * 0x438),
                            1);
          pOStack_20 = pOStack_20 + 1;
          OVar1 = opj_j2k_read_SPCod_SPCoc
                            ((opj_j2k_t *)p_header_data_local,local_50,pOStack_20,
                             (OPJ_UINT32 *)((long)&p_manager_local + 4),(opj_event_mgr_t *)l_cp);
          if (OVar1 == 0) {
            opj_event_msg((opj_event_mgr_t *)l_cp,1,"Error reading COC marker\n");
            p_j2k_local._4_4_ = 0;
          }
          else if (p_manager_local._4_4_ == 0) {
            p_j2k_local._4_4_ = 1;
          }
          else {
            opj_event_msg((opj_event_mgr_t *)l_cp,1,"Error reading COC marker\n");
            p_j2k_local._4_4_ = 0;
          }
        }
        else {
          opj_event_msg((opj_event_mgr_t *)l_cp,1,
                        "Error reading COC marker (bad number of components)\n");
          p_j2k_local._4_4_ = 0;
        }
      }
      return p_j2k_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xb69,
                  "OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0xb68,
                "OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    opj_cp_t *l_cp = NULL;
    opj_tcp_t *l_tcp = NULL;
    opj_image_t *l_image = NULL;
    OPJ_UINT32 l_comp_room;
    OPJ_UINT32 l_comp_no;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH)
            ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;
    l_image = p_j2k->m_private_image;

    l_comp_room = l_image->numcomps <= 256 ? 1 : 2;

    /* make sure room is sufficient*/
    if (p_header_size < l_comp_room + 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COC marker\n");
        return OPJ_FALSE;
    }
    p_header_size -= l_comp_room + 1;

    opj_read_bytes(p_header_data, &l_comp_no,
                   l_comp_room);                 /* Ccoc */
    p_header_data += l_comp_room;
    if (l_comp_no >= l_image->numcomps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error reading COC marker (bad number of components)\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_tcp->tccps[l_comp_no].csty,
                   1);                  /* Scoc */
    ++p_header_data ;

    if (! opj_j2k_read_SPCod_SPCoc(p_j2k, l_comp_no, p_header_data, &p_header_size,
                                   p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COC marker\n");
        return OPJ_FALSE;
    }

    if (p_header_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COC marker\n");
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}